

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_assign_out_of_range_Test::~VectorSUnitTest_assign_out_of_range_Test
          (VectorSUnitTest_assign_out_of_range_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, assign_out_of_range)
{
    std::vector<unsigned> v_src{0u,1u,2u,3u,4u};
    std::vector<unsigned> v_src_too_big{0u,1u,2u,3u,4u,5u};
    using vec_t = vector_s<unsigned, 5>;
    vec_t v;
    EXPECT_THROW( (v = {0u, 1u, 2u, 3u, 4u, 5u}), std::range_error );
    EXPECT_NO_THROW( v.assign(v_src.begin(), v_src.end()) );
    EXPECT_THROW(v.assign(v_src.end(), v_src.begin()), std::out_of_range);
    EXPECT_THROW(v.assign(v_src_too_big.begin(), v_src_too_big.end()), std::range_error);
}